

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

bool __thiscall BasicContainer::intersect(BasicContainer *this,Ray *ray,Hit *result)

{
  bool bVar1;
  data_t dVar2;
  point pVar3;
  vec3f vVar4;
  HitTmp HVar5;
  Triangle *local_168;
  undefined8 local_150;
  data_t local_148;
  undefined8 local_130;
  data_t local_128;
  undefined1 local_110 [8];
  mat3x2f jacobi;
  vec3f local_e0 [2];
  data_t local_c8;
  vec3f local_c0;
  Hit local_b0;
  point local_68;
  undefined1 local_58 [8];
  point p;
  undefined1 local_38 [8];
  HitTmp tmp;
  Hit *result_local;
  Ray *ray_local;
  BasicContainer *this_local;
  
  tmp._8_8_ = result;
  HVar5 = treehit(this,ray,this->root);
  register0x00000000 = HVar5.primitive;
  tmp.primitive._0_4_ = HVar5.t;
  local_38 = (undefined1  [8])register0x00000000;
  bVar1 = HitTmp::operator_cast_to_bool((HitTmp *)local_38);
  if (bVar1) {
    pVar3 = Ray::atParam(ray,tmp.primitive._0_4_);
    dVar2 = pVar3.z;
    local_68._0_8_ = pVar3._0_8_;
    local_58._0_4_ = local_68.x;
    local_58._4_4_ = local_68.y;
    local_68 = pVar3;
    p.x = dVar2;
    (*((Primitive *)local_38)->_vptr_Primitive[4])();
    local_c8 = dVar2;
    local_c0.z = dVar2;
    (*((Primitive *)local_38)->_vptr_Primitive[5])(local_38,local_58);
    local_e0[0].z = dVar2;
    (*((Primitive *)local_38)->_vptr_Primitive[6])(local_38,local_58);
    Primitive::Hit::Hit(&local_b0,(point *)local_58,&local_c0,local_e0,(vec2f *)(jacobi.data + 2));
    memcpy((void *)tmp._8_8_,&local_b0,0x48);
    if (local_38 == (undefined1  [8])0x0) {
      local_168 = (Triangle *)0x0;
    }
    else {
      local_168 = (Triangle *)
                  __dynamic_cast(local_38,&BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
    }
    Triangle::jacobi((mat3x2f *)local_110,local_168);
    vVar4 = mat3x2f::column((mat3x2f *)local_110,0);
    local_128 = vVar4.z;
    local_130 = vVar4._0_8_;
    *(data_t *)(tmp._8_8_ + 0x38) = local_128;
    *(undefined8 *)(tmp._8_8_ + 0x30) = local_130;
    vVar4 = mat3x2f::column((mat3x2f *)local_110,1);
    local_150 = vVar4._0_8_;
    local_148 = vVar4.z;
    *(undefined8 *)(tmp._8_8_ + 0x3c) = local_150;
    *(data_t *)(tmp._8_8_ + 0x44) = local_148;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const override
	{
		HitTmp tmp = treehit(ray, root);
		if (!tmp) return false;
		point p = ray.atParam(tmp.t);
		*result = Hit(p, tmp.primitive->Ns(p), tmp.primitive->Ng(p), tmp.primitive->uv(p));
		auto jacobi = dynamic_cast<Triangle const*>(tmp.primitive)->jacobi();
		// TODO implement for other types of primitive
		result->dpdu = jacobi.column(0);
		result->dpdv = jacobi.column(1);
		return true;
	}